

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblp_std.cpp
# Opt level: O0

void * parseElement(SymbolContext<char> *ctx)

{
  bool bVar1;
  string *psVar2;
  XMLElement *this;
  XMLElement *year;
  string n;
  XMLElement *elem;
  SymbolContext<char> *ctx_local;
  
  ctx_local = (SymbolContext<char> *)operator_new(0x88);
  XMLElement::XMLElement((XMLElement *)ctx_local,ctx);
  psVar2 = XMLElement::get_name_abi_cxx11_((XMLElement *)ctx_local);
  std::__cxx11::string::string((string *)&year,(string *)psVar2);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&year
                          ,"article");
  if (bVar1) {
    this = XMLElement::get_element((XMLElement *)ctx_local,"year");
    if (this != (XMLElement *)0x0) {
      psVar2 = XMLElement::get_content_abi_cxx11_(this);
      bVar1 = std::operator==(psVar2,"1990");
      if (bVar1) goto LAB_00123d54;
    }
    if ((XMLElement *)ctx_local != (XMLElement *)0x0) {
      XMLElement::~XMLElement((XMLElement *)ctx_local);
      operator_delete(ctx_local);
    }
    ctx_local = (SymbolContext<char> *)operator_new(0x88);
    XMLElement::XMLElement((XMLElement *)ctx_local,(string *)&year);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &year,"inproceedings");
    if ((((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&year,"proceedings"), bVar1)) ||
        (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&year,"book"), bVar1)) ||
       (((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&year,"incollection"), bVar1 ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&year,"phdthesis"), bVar1)) ||
        ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&year,"mastersthesis"), bVar1 ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&year,"www"), bVar1)))))) {
      if ((XMLElement *)ctx_local != (XMLElement *)0x0) {
        XMLElement::~XMLElement((XMLElement *)ctx_local);
        operator_delete(ctx_local);
      }
      ctx_local = (SymbolContext<char> *)operator_new(0x88);
      XMLElement::XMLElement((XMLElement *)ctx_local,(string *)&year);
    }
  }
LAB_00123d54:
  std::__cxx11::string::~string((string *)&year);
  return ctx_local;
}

Assistant:

void *parseElement(const SymbolContext<char>& ctx)
{
    XMLElement *elem = new XMLElement(ctx);

    std::string n = elem->get_name();
    if (n == "article")
    {
        const XMLElement *year = elem->get_element("year");
        if (year != nullptr && year->get_content() == "1990")
        {
          // count++
        }
        else
        {
            delete elem;
            return new XMLElement(n);
        }
    }
    else if (n == "inproceedings" || n == "proceedings" || n == "book" || n == "incollection" || n == "phdthesis" || n == "mastersthesis" || n == "www")
    {
        delete elem;
        return new XMLElement(n);
    }
    return elem;
}